

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O1

int Imf_3_4::anon_unknown_5::viewNum(string *view,StringVector *multiView)

{
  pointer pbVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  long lVar5;
  size_type *psVar6;
  
  pbVar1 = (multiView->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(multiView->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 5;
    __s2 = (view->_M_dataplus)._M_p;
    sVar2 = view->_M_string_length;
    psVar6 = &pbVar1->_M_string_length;
    lVar4 = 0;
    do {
      __n = *psVar6;
      if ((__n == sVar2) &&
         ((__n == 0 ||
          (iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (psVar6 + -1))->_M_dataplus)._M_p,__s2,__n), iVar3 == 0)))) {
        return (int)lVar4;
      }
      lVar4 = lVar4 + 1;
      psVar6 = psVar6 + 4;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar4);
  }
  return -1;
}

Assistant:

int
viewNum (const string& view, const StringVector& multiView)
{
    //
    // returns which view number is called 'view'
    // returns -1 if no member of multiView is 'view'
    // (i.e. if viewNum() returns -1, 'view' isn't a view name
    //       if viewNum() returns 0, 'view' is the default view
    // otherwise, it's some other (valid) view
    //

    for (size_t i = 0; i < multiView.size (); ++i)
    {
        if (multiView[i] == view) return i;
    }

    return -1;
}